

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_geometry(Impl *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Builder *this_00;
  MDOperand *md;
  MDNode *node;
  Function *entryPoint;
  LoggingCallback p_Var6;
  void *pvVar7;
  char local_2068 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  uint gs_instances;
  PrimitiveTopology topology;
  Function *func;
  uint max_vertex_count;
  InputPrimitive input_primitive;
  MDNode *arguments;
  MDOperand *gs_state_node;
  Builder *builder;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityGeometry);
  md = get_shader_property_tag(this->entry_point_meta,GSState);
  if (md == (MDOperand *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    node = LLVMBC::cast<LLVMBC::MDNode>(md);
    uVar3 = get_constant_metadata<unsigned_int>(node,0);
    bVar1 = (byte)uVar3;
    uVar3 = get_constant_metadata<unsigned_int>(node,1);
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    uVar4 = get_constant_metadata<unsigned_int>(node,3);
    bVar2 = (byte)uVar4;
    uVar4 = get_constant_metadata<unsigned_int>(node,4);
    uVar5 = get_constant_metadata<unsigned_int>(node,2);
    (this->execution_mode_meta).gs_stream_active_mask = uVar5;
    spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeInvocations,uVar4,-1,-1);
    spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputVertices,uVar3,-1,-1);
    switch(bVar1) {
    case 1:
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeInputPoints,-1,-1,-1);
      (this->execution_mode_meta).stage_input_num_vertex = 1;
      break;
    case 2:
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeInputLines,-1,-1,-1);
      (this->execution_mode_meta).stage_input_num_vertex = 2;
      break;
    case 3:
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeTriangles,-1,-1,-1);
      (this->execution_mode_meta).stage_input_num_vertex = 3;
      break;
    default:
      p_Var6 = get_thread_log_callback();
      if (p_Var6 == (LoggingCallback)0x0) {
        fprintf(_stderr,"[ERROR]: Unexpected input primitive (%u).\n",(ulong)bVar1);
        fflush(_stderr);
      }
      else {
        snprintf((char *)&cb_1,0x1000,"Unexpected input primitive (%u).\n",(ulong)bVar1);
        pvVar7 = get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,(char *)&cb_1);
      }
      return false;
    case 6:
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeInputLinesAdjacency,-1,-1,-1);
      (this->execution_mode_meta).stage_input_num_vertex = 4;
      break;
    case 7:
      spv::Builder::addExecutionMode
                (this_00,entryPoint,ExecutionModeInputTrianglesAdjacency,-1,-1,-1);
      (this->execution_mode_meta).stage_input_num_vertex = 6;
    }
    if (bVar2 == 1) {
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputPoints,-1,-1,-1);
    }
    else if (bVar2 == 3) {
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputLineStrip,-1,-1,-1);
    }
    else {
      if (bVar2 != 5) {
        p_Var6 = get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Unexpected output primitive topology (%u).\n",(ulong)bVar2);
          fflush(_stderr);
        }
        else {
          snprintf(local_2068,0x1000,"Unexpected output primitive topology (%u).\n",(ulong)bVar2);
          pvVar7 = get_thread_log_callback_userdata();
          (*p_Var6)(pvVar7,Error,local_2068);
        }
        return false;
      }
      spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputTriangleStrip,-1,-1,-1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_execution_modes_geometry()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityGeometry);
	auto *gs_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::GSState);

	if (gs_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*gs_state_node);

		auto input_primitive = static_cast<DXIL::InputPrimitive>(get_constant_metadata(arguments, 0));
		unsigned max_vertex_count = get_constant_metadata(arguments, 1);

		auto *func = spirv_module.get_entry_function();

		auto topology = static_cast<DXIL::PrimitiveTopology>(get_constant_metadata(arguments, 3));
		unsigned gs_instances = get_constant_metadata(arguments, 4);

		execution_mode_meta.gs_stream_active_mask = get_constant_metadata(arguments, 2);

		builder.addExecutionMode(func, spv::ExecutionModeInvocations, gs_instances);
		builder.addExecutionMode(func, spv::ExecutionModeOutputVertices, max_vertex_count);

		switch (input_primitive)
		{
		case DXIL::InputPrimitive::Point:
			builder.addExecutionMode(func, spv::ExecutionModeInputPoints);
			execution_mode_meta.stage_input_num_vertex = 1;
			break;

		case DXIL::InputPrimitive::Line:
			builder.addExecutionMode(func, spv::ExecutionModeInputLines);
			execution_mode_meta.stage_input_num_vertex = 2;
			break;

		case DXIL::InputPrimitive::LineWithAdjacency:
			builder.addExecutionMode(func, spv::ExecutionModeInputLinesAdjacency);
			execution_mode_meta.stage_input_num_vertex = 4;
			break;

		case DXIL::InputPrimitive::Triangle:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			execution_mode_meta.stage_input_num_vertex = 3;
			break;

		case DXIL::InputPrimitive::TriangleWithAdjaceny:
			builder.addExecutionMode(func, spv::ExecutionModeInputTrianglesAdjacency);
			execution_mode_meta.stage_input_num_vertex = 6;
			break;

		default:
			LOGE("Unexpected input primitive (%u).\n", unsigned(input_primitive));
			return false;
		}

		switch (topology)
		{
		case DXIL::PrimitiveTopology::PointList:
			builder.addExecutionMode(func, spv::ExecutionModeOutputPoints);
			break;

		case DXIL::PrimitiveTopology::LineStrip:
			builder.addExecutionMode(func, spv::ExecutionModeOutputLineStrip);
			break;

		case DXIL::PrimitiveTopology::TriangleStrip:
			builder.addExecutionMode(func, spv::ExecutionModeOutputTriangleStrip);
			break;

		default:
			LOGE("Unexpected output primitive topology (%u).\n", unsigned(topology));
			return false;
		}
		return true;
	}
	else
		return false;
}